

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O0

char * translate_health_indicator(uint8_t health_indicator)

{
  char *pcStack_10;
  uint8_t health_indicator_local;
  
  switch(health_indicator) {
  case '\0':
    pcStack_10 = "HEALTHY";
    break;
  case '\x01':
    pcStack_10 = "DEGRADED";
    break;
  case '\x02':
    pcStack_10 = "CRITICAL";
    break;
  case '\x03':
    pcStack_10 = "REPLACE";
    break;
  default:
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

static const char *translate_health_indicator(uint8_t health_indicator)
{
    switch (health_indicator) {
    case  IGSC_HEALTH_INDICATOR_HEALTHY:
        return "HEALTHY";
    case  IGSC_HEALTH_INDICATOR_DEGRADED:
        return "DEGRADED";
    case  IGSC_HEALTH_INDICATOR_CRITICAL:
        return "CRITICAL";
    case  IGSC_HEALTH_INDICATOR_REPLACE:
        return "REPLACE";
    default:
        return "UNKNOWN";
    }
}